

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_decoder.c
# Opt level: O2

aom_codec_err_t
aom_codec_dec_init_ver
          (aom_codec_ctx_t *ctx,aom_codec_iface_t *iface,aom_codec_dec_cfg_t *cfg,
          aom_codec_flags_t flags,int ver)

{
  aom_codec_err_t aVar1;
  char *pcVar2;
  
  if (ver == 0x16) {
    if (iface != (aom_codec_iface_t *)0x0 && ctx != (aom_codec_ctx_t *)0x0) {
      if (iface->abi_version == 7) {
        if ((iface->caps & 1) == 0) {
          aVar1 = AOM_CODEC_INCAPABLE;
        }
        else {
          ctx->name = (char *)0x0;
          ctx->iface = (aom_codec_iface_t *)0x0;
          ctx->init_flags = 0;
          (ctx->config).dec = (aom_codec_dec_cfg *)0x0;
          *(undefined8 *)&ctx->err = 0;
          ctx->err_detail = (char *)0x0;
          ctx->priv = (aom_codec_priv_t *)0x0;
          ctx->iface = iface;
          ctx->name = iface->name;
          ctx->init_flags = flags;
          (ctx->config).dec = cfg;
          aVar1 = (*iface->init)(ctx);
          if (aVar1 == AOM_CODEC_OK) {
            aVar1 = AOM_CODEC_OK;
          }
          else {
            if (ctx->priv == (aom_codec_priv_t *)0x0) {
              pcVar2 = (char *)0x0;
            }
            else {
              pcVar2 = ctx->priv->err_detail;
            }
            ctx->err_detail = pcVar2;
            aom_codec_destroy(ctx);
          }
        }
      }
      else {
        aVar1 = AOM_CODEC_ABI_MISMATCH;
      }
      goto LAB_00159703;
    }
    aVar1 = AOM_CODEC_INVALID_PARAM;
  }
  else {
    aVar1 = AOM_CODEC_ABI_MISMATCH;
  }
  if (ctx == (aom_codec_ctx_t *)0x0) {
    return aVar1;
  }
LAB_00159703:
  ctx->err = aVar1;
  return aVar1;
}

Assistant:

aom_codec_err_t aom_codec_dec_init_ver(aom_codec_ctx_t *ctx,
                                       aom_codec_iface_t *iface,
                                       const aom_codec_dec_cfg_t *cfg,
                                       aom_codec_flags_t flags, int ver) {
  aom_codec_err_t res;

  if (ver != AOM_DECODER_ABI_VERSION)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!ctx || !iface)
    res = AOM_CODEC_INVALID_PARAM;
  else if (iface->abi_version != AOM_CODEC_INTERNAL_ABI_VERSION)
    res = AOM_CODEC_ABI_MISMATCH;
  else if (!(iface->caps & AOM_CODEC_CAP_DECODER))
    res = AOM_CODEC_INCAPABLE;
  else {
    memset(ctx, 0, sizeof(*ctx));
    ctx->iface = iface;
    ctx->name = iface->name;
    ctx->priv = NULL;
    ctx->init_flags = flags;
    ctx->config.dec = cfg;

    res = ctx->iface->init(ctx);
    if (res) {
      ctx->err_detail = ctx->priv ? ctx->priv->err_detail : NULL;
      aom_codec_destroy(ctx);
    }
  }

  return SAVE_STATUS(ctx, res);
}